

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cell.hpp
# Opt level: O0

void __thiscall Excel::Cell::Cell(Cell *this)

{
  Formula *in_RDI;
  Formula *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::wstring::wstring((wstring *)in_RDI);
  (this_00->m_stringValue)._M_string_length = 0;
  Formula::Formula(this_00);
  *(undefined1 *)&in_RDI[1].m_stringValue.field_2 = 1;
  in_RDI[1].m_stringValue.field_2._M_local_buf[1] = L'\0';
  return;
}

Assistant:

inline
Cell::Cell()
	:	m_doubleData( 0.0 )
	,	m_isNull( true )
	,	m_type( DataType::Unknown )
{
}